

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fShaderApiTests.cpp
# Opt level: O1

void __thiscall
deqp::gles3::Functional::ShaderSourceSplitCase::ShaderSourceSplitCase
          (ShaderSourceSplitCase *this,Context *context,char *name,char *desc,ShaderType shaderType,
          int numSlices,deUint32 flags)

{
  deUint32 dVar1;
  
  ApiCase::ApiCase(&this->super_ApiCase,context,name,desc);
  (this->super_ApiCase).super_TestCase.super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__ShaderSourceSplitCase_00d1f438;
  dVar1 = deStringHash((this->super_ApiCase).super_TestCase.super_TestCase.super_TestNode.m_name.
                       _M_dataplus._M_p);
  deRandom_init(&(this->m_rnd).m_rnd,dVar1 ^ 0x4fb2337d);
  this->m_shaderType = shaderType;
  this->m_numSlices = numSlices;
  this->m_explicitLengths = (bool)((byte)flags & 1);
  this->m_randomNullTerm = (bool)((byte)flags >> 1 & 1);
  return;
}

Assistant:

ShaderSourceSplitCase (Context& context, const char* name, const char* desc, glu::ShaderType shaderType, const int numSlices, const deUint32 flags = 0)
		: ApiCase			(context, name, desc)
		, m_rnd				(deStringHash(getName()) ^ 0x4fb2337d)
		, m_shaderType		(shaderType)
		, m_numSlices		(numSlices)
		, m_explicitLengths	((flags & CASE_EXPLICIT_SOURCE_LENGTHS)	!= 0)
		, m_randomNullTerm	((flags & CASE_RANDOM_NULL_TERMINATED)	!= 0)
	{
		DE_ASSERT(m_shaderType == glu::SHADERTYPE_VERTEX || m_shaderType == glu::SHADERTYPE_FRAGMENT);
	}